

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

void bcf_sr_destroy(bcf_srs_t *files)

{
  long lVar1;
  long lVar2;
  
  if (0 < files->nreaders) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      bcf_sr_destroy1((bcf_sr_t *)((long)&files->readers->file + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x60;
    } while (lVar2 < files->nreaders);
  }
  free(files->has_line);
  free(files->readers);
  if (0 < files->n_smpl) {
    lVar1 = 0;
    do {
      free(files->samples[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < files->n_smpl);
  }
  free(files->samples);
  if (files->targets != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->targets);
  }
  if (files->regions != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->regions);
  }
  if ((files->tmps).m != 0) {
    free((files->tmps).s);
  }
  free(files);
  return;
}

Assistant:

void bcf_sr_destroy(bcf_srs_t *files)
{
    int i;
    for (i=0; i<files->nreaders; i++)
        bcf_sr_destroy1(&files->readers[i]);
    free(files->has_line);
    free(files->readers);
    for (i=0; i<files->n_smpl; i++) free(files->samples[i]);
    free(files->samples);
    if (files->targets) bcf_sr_regions_destroy(files->targets);
    if (files->regions) bcf_sr_regions_destroy(files->regions);
    if ( files->tmps.m ) free(files->tmps.s);
    free(files);
}